

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QList<QRect> *
QMdi::MinOverlapPlacer::findMaxOverlappers
          (QList<QRect> *__return_storage_ptr__,QRect *domain,QList<QRect> *source)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QRect *srcRect;
  QRect *args;
  undefined1 auVar4 [16];
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QRect *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QRect>::reserve(__return_storage_ptr__,(source->d).size);
  args = (source->d).ptr;
  iVar1 = -1;
  for (lVar3 = (source->d).size << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    auVar4 = QRect::operator&(domain,args);
    iVar2 = ((auVar4._12_4_ - auVar4._4_4_) + 1) * ((auVar4._8_4_ - auVar4._0_4_) + 1);
    if (iVar1 == -1 || iVar1 <= iVar2) {
      if (iVar1 < iVar2) {
        QList<QRect>::clear(__return_storage_ptr__);
        iVar1 = iVar2;
      }
      QList<QRect>::emplaceBack<QRect_const&>(__return_storage_ptr__,args);
    }
    args = args + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QRect> MinOverlapPlacer::findMaxOverlappers(const QRect &domain, const QList<QRect> &source)
{
    QList<QRect> result;
    result.reserve(source.size());

    int maxOverlap = -1;
    for (const QRect &srcRect : source) {
        QRect intersection = domain.intersected(srcRect);
        const int overlap = intersection.width() * intersection.height();
        if (overlap >= maxOverlap || maxOverlap == -1) {
            if (overlap > maxOverlap) {
                maxOverlap = overlap;
                result.clear();
            }
            result << srcRect;
        }
    }

    return result;
}